

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncGenerator.h
# Opt level: O1

void __thiscall
Js::JavascriptAsyncGenerator::JavascriptAsyncGenerator
          (JavascriptAsyncGenerator *this,DynamicType *type,Arguments *args,
          ScriptFunction *scriptFunction,RequestQueue *requestQueue)

{
  JavascriptGenerator::JavascriptGenerator
            (&this->super_JavascriptGenerator,type,args,scriptFunction);
  (this->super_JavascriptGenerator).super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014cb6f0;
  Memory::Recycler::WBSetBit((char *)&this->requestQueue);
  (this->requestQueue).ptr = requestQueue;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->requestQueue);
  this->pendingState = None;
  (this->onFulfilled).ptr = (RuntimeFunction *)0x0;
  (this->onRejected).ptr = (RuntimeFunction *)0x0;
  return;
}

Assistant:

JavascriptAsyncGenerator(
        DynamicType* type,
        Arguments& args,
        ScriptFunction* scriptFunction,
        RequestQueue* requestQueue) :
            JavascriptGenerator(type, args, scriptFunction),
            requestQueue(requestQueue) {}